

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

int * __thiscall
google::protobuf::internal::ExtensionSet::GetRefRepeatedEnum
          (ExtensionSet *this,int number,int index)

{
  byte bVar1;
  Extension *pEVar2;
  LogMessage *pLVar3;
  int *piVar4;
  LogFinisher local_59;
  LogMessage local_58;
  
  pEVar2 = FindOrNull(this,number);
  if (pEVar2 == (Extension *)0x0) {
    LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
               ,0x210);
    pLVar3 = LogMessage::operator<<(&local_58,"CHECK failed: extension != nullptr: ");
    pLVar3 = LogMessage::operator<<(pLVar3,"Index out-of-bounds (field is empty).");
    LogFinisher::operator=(&local_59,pLVar3);
    LogMessage::~LogMessage(&local_58);
  }
  if (pEVar2->is_repeated == false) {
    LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
               ,0x211);
    pLVar3 = LogMessage::operator<<
                       (&local_58,
                        "CHECK failed: ((*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD) == (REPEATED_FIELD): "
                       );
    LogFinisher::operator=(&local_59,pLVar3);
    LogMessage::~LogMessage(&local_58);
  }
  bVar1 = pEVar2->type;
  if ((byte)(bVar1 - 0x13) < 0xee) {
    LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
               ,0x3f);
    pLVar3 = LogMessage::operator<<
                       (&local_58,
                        "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
    LogFinisher::operator=(&local_59,pLVar3);
    LogMessage::~LogMessage(&local_58);
  }
  if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)bVar1 * 4) != 8) {
    LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
               ,0x211);
    pLVar3 = LogMessage::operator<<
                       (&local_58,
                        "CHECK failed: (cpp_type((*extension).type)) == (WireFormatLite::CPPTYPE_ENUM): "
                       );
    LogFinisher::operator=(&local_59,pLVar3);
    LogMessage::~LogMessage(&local_58);
  }
  piVar4 = RepeatedField<int>::Get((pEVar2->field_0).repeated_int32_t_value,index);
  return piVar4;
}

Assistant:

const int& ExtensionSet::GetRefRepeatedEnum(int number, int index) const {
  const Extension* extension = FindOrNull(number);
  GOOGLE_CHECK(extension != nullptr) << "Index out-of-bounds (field is empty).";
  GOOGLE_DCHECK_TYPE(*extension, REPEATED_FIELD, ENUM);
  return extension->repeated_enum_value->Get(index);
}